

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cc
# Opt level: O0

void __thiscall tt::net::EventLoop::handleRead(EventLoop *this)

{
  LogStream *pLVar1;
  element_type *this_00;
  Logger local_ff8;
  ssize_t local_20;
  ssize_t n;
  uint64_t one;
  EventLoop *this_local;
  
  n = 1;
  one = (uint64_t)this;
  local_20 = readn(this->m_wakeupFd,&n,8);
  if (local_20 != 8) {
    Logger::Logger(&local_ff8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/EventLoop.cc"
                   ,0x65);
    pLVar1 = Logger::stream(&local_ff8);
    pLVar1 = LogStream::operator<<(pLVar1,"EventLoop::handleRead() reads ");
    pLVar1 = LogStream::operator<<(pLVar1,local_20);
    LogStream::operator<<(pLVar1,"bytes instead of 8");
    Logger::~Logger(&local_ff8);
  }
  this_00 = std::__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->m_wakeupChannel);
  Channel::setEvents(this_00,0x80000001);
  return;
}

Assistant:

void EventLoop::handleRead(){

	uint64_t one = 1;
	ssize_t n = readn(m_wakeupFd, &one, sizeof(one));

	if(n != sizeof(one)){
		LOG << "EventLoop::handleRead() reads " << n << "bytes instead of 8";
	}

	m_wakeupChannel->setEvents(EPOLLIN | EPOLLET);
}